

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O0

void rhash_reset(rhash ctx)

{
  long lVar1;
  rhash_hash_info *info;
  uint i;
  rhash_context_ext *ectx;
  rhash ctx_local;
  
  if ((int)ctx[1].msg_size == 0) {
    __assert_fail("ectx->hash_vector_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                  ,0xd1,"void rhash_reset(rhash)");
  }
  if ((uint)ctx[1].msg_size < 0xb) {
    ctx[1].hash_id = 0xb01dbabe;
    info._4_4_ = 0;
    while( true ) {
      if ((uint)ctx[1].msg_size <= info._4_4_) {
        *(uint *)((long)&ctx[1].msg_size + 4) = *(uint *)((long)&ctx[1].msg_size + 4) & 0xfffffffd;
        return;
      }
      lVar1 = *(long *)&ctx[(ulong)info._4_4_ + 3].hash_id;
      if (*(long *)(lVar1 + 0x30) != 0) {
        (**(code **)(lVar1 + 0x30))(ctx[(ulong)info._4_4_ + 4].msg_size);
      }
      if (*(long *)(lVar1 + 0x18) == 0) break;
      (**(code **)(lVar1 + 0x18))(ctx[(ulong)info._4_4_ + 4].msg_size);
      info._4_4_ = info._4_4_ + 1;
    }
    __assert_fail("info->init != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                  ,0xdc,"void rhash_reset(rhash)");
  }
  __assert_fail("ectx->hash_vector_size <= RHASH_HASH_COUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmlibrhash/librhash/rhash.c"
                ,0xd2,"void rhash_reset(rhash)");
}

Assistant:

RHASH_API void rhash_reset(rhash ctx)
{
	rhash_context_ext* const ectx = (rhash_context_ext*)ctx;
	unsigned i;

	assert(ectx->hash_vector_size > 0);
	assert(ectx->hash_vector_size <= RHASH_HASH_COUNT);
	ectx->state = STATE_ACTIVE; /* re-activate the structure */

	/* re-initialize every hash in a loop */
	for (i = 0; i < ectx->hash_vector_size; i++) {
		struct rhash_hash_info* info = ectx->vector[i].hash_info;
		if (info->cleanup != 0) {
			info->cleanup(ectx->vector[i].context);
		}

		assert(info->init != NULL);
		info->init(ectx->vector[i].context);
	}
	ectx->flags &= ~RCTX_FINALIZED; /* clear finalized state */
}